

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableNeuralNetworkValidator.cpp
# Opt level: O0

Result * validateOtherTopLevelUpdateParameters
                   (Result *__return_storage_ptr__,NetworkUpdateParameters *updateParameters)

{
  Result *pRVar1;
  bool bVar2;
  Int64Parameter *pIVar3;
  allocator local_109;
  string local_108;
  Result local_e8;
  allocator local_b9;
  string local_b8;
  Result local_98;
  undefined4 local_70;
  undefined1 local_60 [8];
  string err;
  Result r;
  NetworkUpdateParameters *updateParameters_local;
  
  CoreML::Result::Result((Result *)((long)&err.field_2 + 8));
  std::__cxx11::string::string((string *)local_60);
  bVar2 = CoreML::Specification::NetworkUpdateParameters::has_epochs(updateParameters);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b8,"epochs",&local_b9);
    pIVar3 = CoreML::Specification::NetworkUpdateParameters::epochs(updateParameters);
    CoreML::validateInt64Parameter(&local_98,&local_b8,pIVar3,true);
    pRVar1 = (Result *)((long)&err.field_2 + 8);
    CoreML::Result::operator=(pRVar1,&local_98);
    CoreML::Result::~Result(&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    bVar2 = CoreML::Result::good(pRVar1);
    if (bVar2) {
      bVar2 = CoreML::Specification::NetworkUpdateParameters::has_seed(updateParameters);
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_108,"seed",&local_109);
        pIVar3 = CoreML::Specification::NetworkUpdateParameters::seed(updateParameters);
        CoreML::validateInt64Parameter(&local_e8,&local_108,pIVar3,false);
        pRVar1 = (Result *)((long)&err.field_2 + 8);
        CoreML::Result::operator=(pRVar1,&local_e8);
        CoreML::Result::~Result(&local_e8);
        std::__cxx11::string::~string((string *)&local_108);
        std::allocator<char>::~allocator((allocator<char> *)&local_109);
        bVar2 = CoreML::Result::good(pRVar1);
        if (!bVar2) {
          CoreML::Result::Result(__return_storage_ptr__,(Result *)((long)&err.field_2 + 8));
          goto LAB_009b032c;
        }
      }
      CoreML::Result::Result(__return_storage_ptr__,(Result *)((long)&err.field_2 + 8));
    }
    else {
      CoreML::Result::Result(__return_storage_ptr__,(Result *)((long)&err.field_2 + 8));
    }
  }
  else {
    std::__cxx11::string::operator=
              ((string *)local_60,"Epochs should be included in neural network update parameters.");
    CoreML::Result::Result
              (__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,(string *)local_60);
  }
LAB_009b032c:
  local_70 = 1;
  std::__cxx11::string::~string((string *)local_60);
  CoreML::Result::~Result((Result *)((long)&err.field_2 + 8));
  return __return_storage_ptr__;
}

Assistant:

static Result validateOtherTopLevelUpdateParameters(const Specification::NetworkUpdateParameters& updateParameters) {
    Result r;
    std::string err;
    
    if (false == updateParameters.has_epochs()) {
        err = "Epochs should be included in neural network update parameters.";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }
    
    r = validateInt64Parameter("epochs", updateParameters.epochs(), true);
    if (!r.good()) {return r;}

    if (updateParameters.has_seed()) {
        r = validateInt64Parameter("seed", updateParameters.seed(), false);
        if (!r.good()) {return r;}
    }

    return r;
}